

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O1

int ffgcks(fitsfile *fptr,unsigned_long *datasum,unsigned_long *hdusum,int *status)

{
  int iVar1;
  ulong uVar2;
  LONGLONG datastart;
  LONGLONG headstart;
  LONGLONG dataend;
  long local_48;
  LONGLONG local_40;
  long local_38;
  
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffghadll(fptr,&local_40,&local_48,&local_38,status);
  if (iVar1 < 1) {
    uVar2 = local_38 - local_48;
    *datasum = 0;
    if (0xb3f < (long)uVar2) {
      ffmbyt(fptr,local_48,0,status);
      iVar1 = ffcsum(fptr,uVar2 / 0xb40,datasum,status);
      if (0 < iVar1) goto LAB_00117262;
    }
    ffmbyt(fptr,local_40,0,status);
    *hdusum = *datasum;
    ffcsum(fptr,(local_48 - local_40) / 0xb40,hdusum,status);
  }
LAB_00117262:
  return *status;
}

Assistant:

int ffgcks(fitsfile *fptr,           /* I - FITS file pointer             */
           unsigned long *datasum,   /* O - data checksum                 */
           unsigned long *hdusum,    /* O - hdu checksum                  */
           int *status)              /* IO - error status                 */

    /* calculate the checksums of the data unit and the total HDU */
{
    long nrec;
    LONGLONG headstart, datastart, dataend;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* get size of the HDU */
    if (ffghadll(fptr, &headstart, &datastart, &dataend, status) > 0)
        return(*status);

    nrec = (long) ((dataend - datastart) / 2880);

    *datasum = 0;

    if (nrec > 0)
    {
        /* accumulate the 32-bit 1's complement checksum */
        ffmbyt(fptr, datastart, REPORT_EOF, status);
        if (ffcsum(fptr, nrec, datasum, status) > 0)
            return(*status);
    }

    /* move to the start of the header and calc. size of header */
    ffmbyt(fptr, headstart, REPORT_EOF, status);
    nrec = (long) ((datastart - headstart) / 2880);

    /* accumulate the header checksum into the previous data checksum */
    *hdusum = *datasum;
    ffcsum(fptr, nrec, hdusum, status);

    return(*status);
}